

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface_tests.cpp
# Opt level: O2

void __thiscall validationinterface_tests::TestInterface::Call(TestInterface *this)

{
  long in_FS_OFFSET;
  BlockValidationState state;
  CBlock block;
  ValidationState<BlockValidationResult> local_d0;
  CBlock local_88;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(&local_88);
  local_d0.m_reject_reason._M_dataplus._M_p = (pointer)&local_d0.m_reject_reason.field_2;
  local_d0.m_mode = M_VALID;
  local_d0.m_result = BLOCK_RESULT_UNSET;
  local_d0.m_reject_reason._M_string_length = 0;
  local_d0.m_reject_reason.field_2._M_local_buf[0] = '\0';
  local_d0.m_debug_message._M_dataplus._M_p = (pointer)&local_d0.m_debug_message.field_2;
  local_d0.m_debug_message._M_string_length = 0;
  local_d0.m_debug_message.field_2._M_local_buf[0] = '\0';
  ValidationSignals::BlockChecked(this->m_signals,&local_88,(BlockValidationState *)&local_d0);
  ValidationState<BlockValidationResult>::~ValidationState(&local_d0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_88.vtx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Call()
    {
        CBlock block;
        BlockValidationState state;
        m_signals.BlockChecked(block, state);
    }